

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_monitor.cpp
# Opt level: O0

void __thiscall
r_exec::PMonitor::PMonitor
          (PMonitor *this,MDLController *controller,BindingMap *bindings,Fact *prediction,
          bool rate_failures)

{
  Pred *this_00;
  _Fact *p_Var1;
  MonitoringJob<r_exec::PMonitor> *this_01;
  uint64_t uVar2;
  long lVar3;
  _Mem *this_02;
  MonitoringJob<r_exec::PMonitor> *j;
  bool rate_failures_local;
  Fact *prediction_local;
  BindingMap *bindings_local;
  MDLController *controller_local;
  PMonitor *this_local;
  
  Monitor::Monitor(&this->super_Monitor,controller,bindings,prediction);
  (this->super_Monitor).super__Object._vptr__Object = (_func_int **)&PTR__PMonitor_002ecb38;
  this->rate_failures = rate_failures;
  this_00 = _Fact::get_pred(&prediction->super__Fact);
  p_Var1 = Pred::get_target(this_00);
  this->prediction_target = p_Var1;
  BindingMap::reset_fwd_timings(bindings,this->prediction_target);
  this_01 = (MonitoringJob<r_exec::PMonitor> *)operator_new(0x28);
  uVar2 = _Fact::get_before(this->prediction_target);
  lVar3 = r_code::Utils::GetTimeTolerance();
  MonitoringJob<r_exec::PMonitor>::MonitoringJob(this_01,this,uVar2 + lVar3);
  this_02 = _Mem::Get();
  _Mem::pushTimeJob(this_02,(TimeJob *)this_01);
  return;
}

Assistant:

PMonitor::PMonitor(MDLController *controller,
                   BindingMap *bindings,
                   Fact *prediction,
                   bool rate_failures): Monitor(controller, bindings, prediction), rate_failures(rate_failures)   // prediction is f0->pred->f1->obj; not simulated.
{
    prediction_target = prediction->get_pred()->get_target(); // f1.
    bindings->reset_fwd_timings(prediction_target);
    MonitoringJob<PMonitor> *j = new MonitoringJob<PMonitor>(this, prediction_target->get_before() + Utils::GetTimeTolerance());
    _Mem::Get()->pushTimeJob(j);
}